

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadSketch.h
# Opt level: O1

void __thiscall
SpreadSketchWrapper<4U>::Check
          (SpreadSketchWrapper<4U> *this,HashMap<4U> *mp,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  pointer ppVar10;
  uint *puVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  _Hash_node_base *p_Var17;
  int iVar18;
  int iVar19;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar27 [16];
  Data<4U> key;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  result;
  HashMap<4U> our_result;
  key_type local_9c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_98;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_78;
  HashMap<4U> *local_70;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = outs;
  local_70 = mp;
  DetectorSS::Query(this->sketch,(this->super_Abstract<4U>).HIT,&local_98);
  ppVar10 = local_98.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar20 = local_98.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_9c.str = (uchar  [4])ppVar20->first;
      uVar3 = ppVar20->second;
      puVar11 = (uint *)std::__detail::
                        _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&local_68,&local_9c);
      *puVar11 = uVar3;
      ppVar20 = ppVar20 + 1;
    } while (ppVar20 != ppVar10);
  }
  p_Var17 = (local_70->_M_h)._M_before_begin._M_nxt;
  if (p_Var17 == (_Hash_node_base *)0x0) {
    auVar21 = ZEXT816(0) << 0x40;
    dVar24 = 0.0;
  }
  else {
    iVar15 = 0;
    iVar19 = 0;
    iVar18 = 0;
    do {
      pmVar12 = std::__detail::
                _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_68,(key_type *)(p_Var17 + 1));
      iVar4 = *pmVar12;
      iVar5 = *(int *)((long)&p_Var17[1]._M_nxt + 4);
      iVar6 = (this->super_Abstract<4U>).HIT;
      if (iVar6 < iVar5) {
        iVar18 = iVar18 + 1;
        if (iVar6 < iVar4) {
          iVar19 = iVar19 + 1;
          iVar14 = iVar5 - iVar4;
          iVar16 = -iVar14;
          if (0 < iVar14) {
            iVar16 = iVar14;
          }
          auVar25._0_8_ = (double)iVar16;
          auVar25._8_8_ = in_XMM2_Qb;
          auVar21._0_8_ = auVar25._0_8_ / (double)iVar5;
          auVar21._8_8_ = in_XMM2_Qb;
          auVar21 = vunpcklpd_avx(auVar25,auVar21);
          (this->super_Abstract<4U>).aae = auVar21._0_8_ + (this->super_Abstract<4U>).aae;
          (this->super_Abstract<4U>).are = auVar21._8_8_ + (this->super_Abstract<4U>).are;
        }
      }
      iVar15 = iVar15 + (uint)(iVar6 < iVar4);
      p_Var17 = p_Var17->_M_nxt;
    } while (p_Var17 != (_Hash_node_base *)0x0);
    dVar24 = (double)iVar19;
    auVar22._0_8_ = (double)iVar18;
    auVar22._8_8_ = in_XMM2_Qb;
    auVar27._0_8_ = (double)iVar15;
    auVar27._8_8_ = in_XMM2_Qb;
    auVar21 = vunpcklpd_avx(auVar27,auVar22);
  }
  auVar2._0_8_ = (this->super_Abstract<4U>).aae;
  auVar2._8_8_ = (this->super_Abstract<4U>).are;
  auVar26._8_8_ = dVar24;
  auVar26._0_8_ = dVar24;
  auVar25 = vdivpd_avx(auVar2,auVar26);
  (this->super_Abstract<4U>).aae = (double)auVar25._0_8_;
  (this->super_Abstract<4U>).are = (double)auVar25._8_8_;
  auVar21 = vdivpd_avx(auVar26,auVar21);
  (this->super_Abstract<4U>).pr = (double)auVar21._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar21._8_8_;
  auVar21 = vshufpd_avx(auVar25,auVar25,1);
  poVar13 = std::ostream::_M_insert<double>(auVar21._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
  poVar13 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).cr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
  poVar13 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
  dVar24 = (this->super_Abstract<4U>).pr;
  dVar1 = (this->super_Abstract<4U>).cr;
  dVar7 = dVar24 + dVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar7;
  uVar8 = vcmpsd_avx512f(auVar23,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar9 = (bool)((byte)uVar8 & 1);
  poVar13 = std::ostream::_M_insert<double>
                      (((dVar24 + dVar24) * dVar1) /
                       (double)((ulong)bVar9 * 0x3ff0000000000000 + (ulong)!bVar9 * (long)dVar7));
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_98.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		vector<pair<key_tp, val_tp>> result;
		sketch->Query(this->HIT, result);
		HashMap<DATA_LEN> our_result;
		for (auto const& p : result) {
			Data<DATA_LEN> key;
			memcpy(key.str, &(p.first), sizeof(Data<DATA_LEN>));
			our_result[key] = p.second;
		}

		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = our_result[it->first];
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}

		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->are << ",";
		*outs[1] << this->cr << ",";
		*outs[2] << this->pr << ",";
		*outs[3] << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + this->pr) << ",";
	}